

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garbage_collection.cpp
# Opt level: O2

void scm::markSchemeObject(Object *obj)

{
  ObjectTypeTag OVar1;
  Object *pOVar2;
  schemeException *this;
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
LAB_00121a16:
  do {
    OVar1 = getTag(obj);
    if (TAG_EOF < OVar1) {
LAB_00121a7f:
      this = (schemeException *)__cxa_allocate_exception(0x30);
      std::__cxx11::to_string(&sStack_78,*(int *)&(obj->super_Collectable).field_0x14);
      std::operator+(&local_58,"tag ",&sStack_78);
      std::operator+(&local_38,&local_58," isn\'t handled yet");
      schemeException::schemeException
                (this,&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/src/garbage_collection.cpp"
                 ,0x41);
      __cxa_throw(this,&schemeException::typeinfo,schemeException::~schemeException);
    }
    if (OVar1 != TAG_CONS) {
      if (OVar1 != TAG_FUNC_USER) {
        if ((0x3bdeU >> (OVar1 & 0x1f) & 1) != 0) {
          (obj->super_Collectable).marked = true;
          return;
        }
        goto LAB_00121a7f;
      }
      pOVar2 = getUserFunctionArgList(obj);
      markSchemeObject(pOVar2);
      obj = getUserFunctionBodyList(obj);
      goto LAB_00121a16;
    }
    pOVar2 = getCar(obj);
    markSchemeObject(pOVar2);
    obj = getCdr(obj);
  } while( true );
}

Assistant:

void markSchemeObject(Object* obj)
{
  switch (getTag(obj)) {
    // in most cases, simply mark the object
    case TAG_INT:
    case TAG_FLOAT:
    case TAG_STRING:
    case TAG_SYMBOL:
    case TAG_NIL:
    case TAG_TRUE:
    case TAG_FALSE:
    case TAG_VOID:
    case TAG_EOF:
    case TAG_FUNC_BUILTIN:
    case TAG_SYNTAX:
      obj->marked = true;
      break;
    // user functions consist of two cons objects, the argument and bodylist
    case TAG_FUNC_USER:
      markSchemeObject(getUserFunctionArgList(obj));
      markSchemeObject(getUserFunctionBodyList(obj));
      break;
    // recur until we've reached the end of the list
    case TAG_CONS:
      markSchemeObject(getCar(obj));
      markSchemeObject(getCdr(obj));
      break;

    default:
      schemeThrow("tag " + std::to_string(obj->tag) + " isn't handled yet");
      break;
  }
}